

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.h
# Opt level: O3

void __thiscall UnscentedKalmanFilter::~UnscentedKalmanFilter(UnscentedKalmanFilter *this)

{
  this->_vptr_UnscentedKalmanFilter = (_func_int **)&PTR__UnscentedKalmanFilter_0014fd00;
  free((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  free((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  free((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

virtual ~UnscentedKalmanFilter() {}